

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void * a2p(char *s)

{
  uchar uVar1;
  int local_1c;
  int n;
  int i;
  anon_union_8_2_f9ecdc5e v;
  char *s_local;
  
  _n = (void *)0x0;
  v = (anon_union_8_2_f9ecdc5e)s;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    uVar1 = x2i(*(char *)((long)v.ret + (long)(local_1c << 1)),
                *(char *)((long)v.ret + (long)(local_1c * 2 + 1)));
    *(uchar *)((long)&n + (long)local_1c) = uVar1;
  }
  return _n;
}

Assistant:

static void *a2p(const char *s) {
  union { void *ret; unsigned char d[sizeof(void*)]; } v;
  v.ret = 0L;
  int i=0, n=sizeof(void*);
  for (i=0; i<n; i++) {
    v.d[i] = x2i(s[2*i], s[2*i+1]);
  }
  return v.ret;
}